

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O1

HRESULT GetParserStateBuffer
                  (LPCSTR fileContents,JsFinalizeCallback fileContentsFinalizeCallback,
                  JsValueRef *parserStateBuffer)

{
  JsErrorCode jsErrorCode;
  size_t sVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  char16_t *format;
  JsValueRef local_38;
  JsValueRef scriptSource;
  
  local_38 = (JsValueRef)0x0;
  sVar1 = strlen(fileContents);
  jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateExternalArrayBuffer)
                          (fileContents,(uint)sVar1,fileContentsFinalizeCallback,fileContents,
                           &local_38);
  if (jsErrorCode == JsNoError) {
    jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSerializeParserState)
                            (local_38,parserStateBuffer,JsParseScriptAttributeNone);
    if (jsErrorCode == JsNoError) {
      return 0;
    }
    pPVar2 = PAL_get_stderr(0);
    pWVar3 = Helpers::JsErrorCodeToString(jsErrorCode);
    format = 
    L"ERROR: ChakraRTInterface::JsSerializeParserState(scriptSource, parserStateBuffer, JsParseScriptAttributeNone) failed. JsErrorCode=0x%x (%s)\n"
    ;
  }
  else {
    pPVar2 = PAL_get_stderr(0);
    pWVar3 = Helpers::JsErrorCodeToString(jsErrorCode);
    format = 
    L"ERROR: ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents, (unsigned int)strlen(fileContents), fileContentsFinalizeCallback, (void*)fileContents, &scriptSource) failed. JsErrorCode=0x%x (%s)\n"
    ;
  }
  PAL_fwprintf(pPVar2,format,(ulong)jsErrorCode,pWVar3);
  pPVar2 = PAL_get_stderr(0);
  PAL_fflush(pPVar2);
  return 0;
}

Assistant:

HRESULT GetParserStateBuffer(LPCSTR fileContents, JsFinalizeCallback fileContentsFinalizeCallback, JsValueRef *parserStateBuffer)
{
    HRESULT hr = S_OK;
    JsValueRef scriptSource = nullptr;

    IfJsErrorFailLog(ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents,
        (unsigned int)strlen(fileContents), fileContentsFinalizeCallback, (void*)fileContents, &scriptSource));

    IfJsErrorFailLog(ChakraRTInterface::JsSerializeParserState(scriptSource, parserStateBuffer, JsParseScriptAttributeNone));

Error:
    return hr;
}